

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::handleBlockWithUnknownJump
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block)

{
  uint uVar1;
  BaseRAPass *pBVar2;
  RABlock *successor;
  Error EVar3;
  RABlock **ppRVar4;
  RABlock *pRVar5;
  size_t i;
  ulong i_00;
  
  pBVar2 = this->_pass;
  uVar1 = *(uint *)&pBVar2->field_0xb8;
  if (((byte)block[0xd] & 2) == 0) {
    pRVar5 = (RABlock *)0x0;
  }
  else {
    ppRVar4 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::RABlock_*> *)(block + 0x68),0);
    pRVar5 = *ppRVar4;
  }
  for (i_00 = 1; i_00 < uVar1; i_00 = i_00 + 1) {
    ppRVar4 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&pBVar2->_blocks,i_00);
    successor = *ppRVar4;
    if ((successor != pRVar5) && (((byte)successor[0xc] & 4) != 0)) {
      RABlock::appendSuccessor(block,successor);
    }
  }
  EVar3 = shareAssignmentAcrossSuccessors(this,block);
  return EVar3;
}

Assistant:

Error handleBlockWithUnknownJump(RABlock* block) noexcept {
    RABlocks& blocks = _pass->blocks();
    size_t blockCount = blocks.size();

    // NOTE: Iterate from `1` as the first block is the entry block, we don't
    // allow the entry to be a successor of any block.
    RABlock* consecutive = block->consecutive();
    for (size_t i = 1; i < blockCount; i++) {
      RABlock* candidate = blocks[i];
      if (candidate == consecutive || !candidate->isTargetable())
        continue;
      block->appendSuccessor(candidate);
    }

    return shareAssignmentAcrossSuccessors(block);
  }